

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddUserItem(cmComputeLinkInformation *this,string *item,bool pathNotKnown)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  Item *this_00;
  Item local_90;
  string lib;
  string out;
  
  uVar2 = (byte)*(item->_M_dataplus)._M_p - 0x24;
  if ((0x3c < uVar2) || ((0x1000000000000201U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
    lib._M_dataplus._M_p = (pointer)&lib.field_2;
    lib._M_string_length = 0;
    lib.field_2._M_local_buf[0] = '\0';
    bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,item);
    if (bVar1) {
      SetCurrentLinkType(this,LinkShared);
      cmsys::RegularExpression::match_abi_cxx11_(&local_90.Value,&this->ExtractSharedLibraryName,2);
LAB_003012c5:
      std::__cxx11::string::operator=((string *)&lib,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      bVar1 = cmsys::RegularExpression::find(&this->ExtractStaticLibraryName,item);
      if (bVar1) {
        SetCurrentLinkType(this,LinkStatic);
        cmsys::RegularExpression::match_abi_cxx11_
                  (&local_90.Value,&this->ExtractStaticLibraryName,2);
        goto LAB_003012c5;
      }
      bVar1 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,item);
      if (bVar1) {
        SetCurrentLinkType(this,this->StartLinkType);
        cmsys::RegularExpression::match_abi_cxx11_(&local_90.Value,&this->ExtractAnyLibraryName,2);
        goto LAB_003012c5;
      }
      if (pathNotKnown) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->OldUserFlagItems,item);
      }
      SetCurrentLinkType(this,this->StartLinkType);
      std::__cxx11::string::_M_assign((string *)&lib);
    }
    std::__cxx11::string::string((string *)&out,(string *)&this->LibLinkFlag);
    std::__cxx11::string::append((string *)&out);
    std::__cxx11::string::append((string *)&out);
    std::__cxx11::string::string((string *)&local_90,(string *)&out);
    local_90.IsPath = false;
    local_90.Target = (cmGeneratorTarget *)0x0;
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&out);
    this_00 = (Item *)&lib;
    goto LAB_0030134e;
  }
  lVar3 = std::__cxx11::string::find((char *)item,0x48b8f5);
  if (lVar3 == 0) {
LAB_003011ca:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->OldUserFlagItems,item);
  }
  else {
    lVar3 = std::__cxx11::string::find((char *)item,0x48b8f1);
    if (lVar3 == 0) goto LAB_003011ca;
  }
  SetCurrentLinkType(this,this->StartLinkType);
  std::__cxx11::string::string((string *)&local_90,(string *)item);
  local_90.IsPath = false;
  local_90.Target = (cmGeneratorTarget *)0x0;
  std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
  emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_90);
  this_00 = &local_90;
LAB_0030134e:
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void cmComputeLinkInformation::AddUserItem(std::string const& item,
                                           bool pathNotKnown)
{
  // This is called to handle a link item that does not match a CMake
  // target and is not a full path.  We check here if it looks like a
  // library file name to automatically request the proper link type
  // from the linker.  For example:
  //
  //   foo       ==>  -lfoo
  //   libfoo.a  ==>  -Wl,-Bstatic -lfoo

  // Pass flags through untouched.
  if(item[0] == '-' || item[0] == '$' || item[0] == '`')
    {
    // if this is a -l option then we might need to warn about
    // CMP0003 so put it in OldUserFlagItems, if it is not a -l
    // or -Wl,-l (-framework -pthread), then allow it without a
    // CMP0003 as -L will not affect those other linker flags
    if(item.find("-l") == 0 ||  item.find("-Wl,-l") == 0)
      {
      // This is a linker option provided by the user.
      this->OldUserFlagItems.push_back(item);
      }

    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use the item verbatim.
    this->Items.push_back(Item(item, false));
    return;
    }

  // Parse out the prefix, base, and suffix components of the
  // library name.  If the name matches that of a shared or static
  // library then set the link type accordingly.
  //
  // Search for shared library names first because some platforms
  // have shared libraries with names that match the static library
  // pattern.  For example cygwin and msys use the convention
  // libfoo.dll.a for import libraries and libfoo.a for static
  // libraries.  On AIX a library with the name libfoo.a can be
  // shared!
  std::string lib;
  if(this->ExtractSharedLibraryName.find(item))
    {
    // This matches a shared library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex matched [%s] [%s] [%s]\n",
            this->ExtractSharedLibraryName.match(1).c_str(),
            this->ExtractSharedLibraryName.match(2).c_str(),
            this->ExtractSharedLibraryName.match(3).c_str());
#endif
    // Set the link type to shared.
    this->SetCurrentLinkType(LinkShared);

    // Use just the library name so the linker will search.
    lib = this->ExtractSharedLibraryName.match(2);
    }
  else if(this->ExtractStaticLibraryName.find(item))
    {
    // This matches a static library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex matched [%s] [%s] [%s]\n",
            this->ExtractStaticLibraryName.match(1).c_str(),
            this->ExtractStaticLibraryName.match(2).c_str(),
            this->ExtractStaticLibraryName.match(3).c_str());
#endif
    // Set the link type to static.
    this->SetCurrentLinkType(LinkStatic);

    // Use just the library name so the linker will search.
    lib = this->ExtractStaticLibraryName.match(2);
    }
  else if(this->ExtractAnyLibraryName.find(item))
    {
    // This matches a library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "any regex matched [%s] [%s] [%s]\n",
            this->ExtractAnyLibraryName.match(1).c_str(),
            this->ExtractAnyLibraryName.match(2).c_str(),
            this->ExtractAnyLibraryName.match(3).c_str());
#endif
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use just the library name so the linker will search.
    lib = this->ExtractAnyLibraryName.match(2);
    }
  else
    {
    // This is a name specified by the user.
    if(pathNotKnown)
      {
      this->OldUserFlagItems.push_back(item);
      }

    // We must ask the linker to search for a library with this name.
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);
    lib = item;
    }

  // Create an option to ask the linker to search for the library.
  std::string out = this->LibLinkFlag;
  out += lib;
  out += this->LibLinkSuffix;
  this->Items.push_back(Item(out, false));

  // Here we could try to find the library the linker will find and
  // add a runtime information entry for it.  It would probably not be
  // reliable and we want to encourage use of full paths for library
  // specification.
}